

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void __thiscall tinygltf::PbrMetallicRoughness::PbrMetallicRoughness(PbrMetallicRoughness *this)

{
  _Rb_tree_header *p_Var1;
  initializer_list<double> __l;
  allocator_type local_29;
  double local_28 [4];
  
  local_28[2] = 1.0;
  local_28[3] = 1.0;
  local_28[0] = 1.0;
  local_28[1] = 1.0;
  __l._M_len = 4;
  __l._M_array = local_28;
  std::vector<double,_std::allocator<double>_>::vector(&this->baseColorFactor,__l,&local_29);
  TextureInfo::TextureInfo(&this->baseColorTexture);
  this->metallicFactor = 1.0;
  this->roughnessFactor = 1.0;
  TextureInfo::TextureInfo(&this->metallicRoughnessTexture);
  Value::Value(&this->extras);
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->extensions)._M_t._M_impl.super__Rb_tree_header;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->extras_json_string)._M_dataplus._M_p = (pointer)&(this->extras_json_string).field_2;
  (this->extras_json_string)._M_string_length = 0;
  (this->extras_json_string).field_2._M_local_buf[0] = '\0';
  (this->extensions_json_string)._M_dataplus._M_p = (pointer)&(this->extensions_json_string).field_2
  ;
  (this->extensions_json_string)._M_string_length = 0;
  (this->extensions_json_string).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

PbrMetallicRoughness() = default;